

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

opStatus __thiscall
llvm::detail::IEEEFloat::addOrSubtract
          (IEEEFloat *this,IEEEFloat *rhs,roundingMode rounding_mode,bool subtract)

{
  byte bVar1;
  opStatus oVar2;
  lostFraction lost_fraction;
  
  oVar2 = addOrSubtractSpecials(this,rhs,subtract);
  if (oVar2 == opDivByZero) {
    lost_fraction = addOrSubtractSignificand(this,rhs,subtract);
    oVar2 = normalize(this,rounding_mode,lost_fraction);
    if ((lost_fraction != lfExactlyZero) && ((this->field_0x12 & 7) == 3)) {
      __assert_fail("category != fcZero || lost_fraction == lfExactlyZero",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x66e,
                    "IEEEFloat::opStatus llvm::detail::IEEEFloat::addOrSubtract(const IEEEFloat &, roundingMode, bool)"
                   );
    }
  }
  bVar1 = this->field_0x12;
  if (((bVar1 & 7) == 3) &&
     (((rhs->field_0x12 & 7) != 3 || ((bool)(((rhs->field_0x12 ^ bVar1) & 8) >> 3) != subtract)))) {
    this->field_0x12 = bVar1 & 0xf3 | (rounding_mode == rmTowardNegative) << 3;
  }
  return oVar2;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::addOrSubtract(const IEEEFloat &rhs,
                                             roundingMode rounding_mode,
                                             bool subtract) {
  opStatus fs;

  fs = addOrSubtractSpecials(rhs, subtract);

  /* This return code means it was not a simple case.  */
  if (fs == opDivByZero) {
    lostFraction lost_fraction;

    lost_fraction = addOrSubtractSignificand(rhs, subtract);
    fs = normalize(rounding_mode, lost_fraction);

    /* Can only be zero if we lost no fraction.  */
    assert(category != fcZero || lost_fraction == lfExactlyZero);
  }

  /* If two numbers add (exactly) to zero, IEEE 754 decrees it is a
     positive zero unless rounding to minus infinity, except that
     adding two like-signed zeroes gives that zero.  */
  if (category == fcZero) {
    if (rhs.category != fcZero || (sign == rhs.sign) == subtract)
      sign = (rounding_mode == rmTowardNegative);
  }

  return fs;
}